

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O0

SBuf * lj_strfmt_putfchar(SBuf *sb,SFormat sf,int32_t c)

{
  uint local_4c;
  char *local_40;
  char *w;
  MSize width;
  int32_t c_local;
  SFormat sf_local;
  SBuf *sb_local;
  char *local_10;
  
  w._4_4_ = sf >> 0x10 & 0xff;
  local_4c = w._4_4_;
  if (w._4_4_ < 2) {
    local_4c = 1;
  }
  if ((uint)((int)sb->e - (int)sb->w) < local_4c) {
    local_10 = lj_buf_more2(sb,local_4c);
  }
  else {
    local_10 = sb->w;
  }
  local_40 = local_10;
  if ((sf & 0x100) != 0) {
    local_40 = local_10 + 1;
    *local_10 = (char)c;
  }
  while (1 < w._4_4_) {
    *local_40 = ' ';
    local_40 = local_40 + 1;
    w._4_4_ = w._4_4_ - 1;
  }
  if ((sf & 0x100) == 0) {
    *local_40 = (char)c;
    local_40 = local_40 + 1;
  }
  sb->w = local_40;
  return sb;
}

Assistant:

SBuf *lj_strfmt_putfchar(SBuf *sb, SFormat sf, int32_t c)
{
  MSize width = STRFMT_WIDTH(sf);
  char *w = lj_buf_more(sb, width > 1 ? width : 1);
  if ((sf & STRFMT_F_LEFT)) *w++ = (char)c;
  while (width-- > 1) *w++ = ' ';
  if (!(sf & STRFMT_F_LEFT)) *w++ = (char)c;
  sb->w = w;
  return sb;
}